

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O0

time_t RelativeDate(time_t Start,time_t zone,int dstmode,time_t DayOrdinal,time_t DayNumber)

{
  long Future;
  long local_58;
  time_t now;
  time_t t;
  tm *tm;
  time_t DayNumber_local;
  time_t DayOrdinal_local;
  time_t tStack_20;
  int dstmode_local;
  time_t zone_local;
  time_t Start_local;
  
  now = Start - zone;
  tm = (tm *)DayNumber;
  DayNumber_local = DayOrdinal;
  DayOrdinal_local._4_4_ = dstmode;
  tStack_20 = zone;
  zone_local = Start;
  t = (time_t)gmtime(&now);
  if (DayNumber_local < 1) {
    local_58 = DayNumber_local;
  }
  else {
    local_58 = DayNumber_local + -1;
  }
  Future = local_58 * 0x93a80 +
           (((long)tm + (7 - (long)((tm *)t)->tm_wday)) % 7) * 0x15180 + zone_local;
  if (DayOrdinal_local._4_4_ == 2) {
    Start_local = DSTcorrect(zone_local,Future);
  }
  else {
    Start_local = Future - zone_local;
  }
  return Start_local;
}

Assistant:

static time_t
RelativeDate(time_t Start, time_t zone, int dstmode,
    time_t DayOrdinal, time_t DayNumber)
{
	struct tm	*tm;
	time_t	t, now;

	t = Start - zone;
	tm = gmtime(&t);
	now = Start;
	now += DAY * ((DayNumber - tm->tm_wday + 7) % 7);
	now += 7 * DAY * (DayOrdinal <= 0 ? DayOrdinal : DayOrdinal - 1);
	if (dstmode == DSTmaybe)
		return DSTcorrect(Start, now);
	return now - Start;
}